

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void __thiscall
tokenized_prompt::tokenized_prompt
          (tokenized_prompt *this,llama_context *ctx,string *pos,string *neg)

{
  bool add_special;
  undefined8 uVar1;
  ulong uVar2;
  ulong len;
  _Vector_base<int,_std::allocator<int>_> _Stack_48;
  
  (this->tokens_neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tokens_neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tokens_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tokens_neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tokens_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tokens_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar1 = llama_get_model(ctx);
  uVar1 = llama_model_get_vocab(uVar1);
  add_special = (bool)llama_vocab_get_add_bos(uVar1);
  common_tokenize((vector<int,_std::allocator<int>_> *)&_Stack_48,ctx,pos,add_special,true);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->tokens_pos,&_Stack_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_48);
  common_tokenize((vector<int,_std::allocator<int>_> *)&_Stack_48,ctx,neg,add_special,true);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->tokens_neg,&_Stack_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_48);
  uVar2 = (long)(this->tokens_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->tokens_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  len = (long)(this->tokens_neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->tokens_neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  if (len < uVar2) {
    len = uVar2;
  }
  this->max_seq_len = len;
  padding_seq(this,ctx,&this->tokens_pos,len);
  padding_seq(this,ctx,&this->tokens_neg,this->max_seq_len);
  return;
}

Assistant:

tokenized_prompt(llama_context * ctx, std::string pos, std::string neg) {
        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);
        const bool add_bos = llama_vocab_get_add_bos(vocab);
        tokens_pos = common_tokenize(ctx, pos, add_bos, true);
        tokens_neg = common_tokenize(ctx, neg, add_bos, true);
        max_seq_len = std::max(tokens_pos.size(), tokens_neg.size());
        padding_seq(ctx, tokens_pos, max_seq_len);
        padding_seq(ctx, tokens_neg, max_seq_len);
    }